

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManFlow(Aig_Man_t *p,Vec_Ptr_t *vSources,int *pnFlow)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  int local_40;
  int i;
  int RetValue;
  int FlowCur;
  int Flow;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut;
  int *pnFlow_local;
  Vec_Ptr_t *vSources_local;
  Aig_Man_t *p_local;
  
  RetValue = 0;
  Aig_ManCleanData(p);
  Aig_ManIncrementTravId(p);
  local_40 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vSources);
    if (iVar1 <= local_40) {
      if (pnFlow != (int *)0x0) {
        *pnFlow = RetValue;
      }
      Aig_ManIncrementTravId(p);
      local_40 = 0;
      while( true ) {
        iVar1 = Vec_PtrSize(vSources);
        if (iVar1 <= local_40) {
          p_00 = Llb_ManFlowMinCut(p);
          iVar1 = Vec_PtrSize(p_00);
          if (iVar1 == RetValue) {
            iVar1 = Llb_ManFlowVerifyCut(p,p_00);
            if (iVar1 == 0) {
              printf("Llb_ManFlow() error! The computed min-cut is not a cut!\n");
            }
            return p_00;
          }
          __assert_fail("Vec_PtrSize(vMinCut) == Flow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                        ,0x32b,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
        }
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSources,local_40);
        if (((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0) ||
           ((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) == 0)) break;
        pAVar3 = Aig_ObjFanin0(pAVar2);
        if ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0) {
          pAVar3 = Aig_ObjFanin0(pAVar2);
          iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar3);
          if (iVar1 != 0) {
            __assert_fail("RetValue == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                          ,800,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
          }
        }
        iVar1 = Aig_ObjIsNode(pAVar2);
        if ((iVar1 != 0) &&
           (pAVar3 = Aig_ObjFanin1(pAVar2), (*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0)) {
          pAVar2 = Aig_ObjFanin1(pAVar2);
          iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar2);
          if (iVar1 != 0) {
            __assert_fail("RetValue == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                          ,0x325,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
          }
        }
        local_40 = local_40 + 1;
      }
      __assert_fail("!pObj->fMarkA && pObj->fMarkB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                    ,0x31c,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSources,local_40);
    if (((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0) ||
       ((*(ulong *)&pAVar2->field_0x18 >> 5 & 1) == 0)) break;
    pAVar3 = Aig_ObjFanin0(pAVar2);
    if ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0) {
      pAVar3 = Aig_ObjFanin0(pAVar2);
      iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar3);
      RetValue = iVar1 + RetValue;
      if (iVar1 != 0) {
        Aig_ManIncrementTravId(p);
      }
    }
    iVar1 = Aig_ObjIsNode(pAVar2);
    if ((iVar1 != 0) &&
       (pAVar3 = Aig_ObjFanin1(pAVar2), (*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0)) {
      pAVar2 = Aig_ObjFanin1(pAVar2);
      iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar2);
      RetValue = iVar1 + RetValue;
      if (iVar1 != 0) {
        Aig_ManIncrementTravId(p);
      }
    }
    local_40 = local_40 + 1;
  }
  __assert_fail("!pObj->fMarkA && pObj->fMarkB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x305,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
}

Assistant:

Vec_Ptr_t * Llb_ManFlow( Aig_Man_t * p, Vec_Ptr_t * vSources, int * pnFlow )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int Flow, FlowCur, RetValue, i;
    // find the max-flow
    Flow = 0;
    Aig_ManCleanData( p );
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSources, pObj, i )
    {
        assert( !pObj->fMarkA && pObj->fMarkB );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
    }
    if ( pnFlow )
        *pnFlow = Flow;

    // mark the nodes reachable from the latches
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSources, pObj, i )
    {
        assert( !pObj->fMarkA && pObj->fMarkB );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            assert( RetValue == 0 );
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            assert( RetValue == 0 );
        }
    }

    // find the min-cut with the smallest volume
    vMinCut = Llb_ManFlowMinCut( p );
    assert( Vec_PtrSize(vMinCut) == Flow );
    // verify the cut
    if ( !Llb_ManFlowVerifyCut(p, vMinCut) )
        printf( "Llb_ManFlow() error! The computed min-cut is not a cut!\n" );
//    Llb_ManFlowPrintCut( p, vMinCut );
    return vMinCut;
}